

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

string_view __thiscall
slang::ast::ElabSystemTaskSymbol::createMessage
          (ElabSystemTaskSymbol *this,ASTContext *context,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> args)

{
  bool bVar1;
  Compilation *this_00;
  Scope *this_01;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_R8;
  byte *__dest;
  string_view sVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> args_local;
  EvalContext evalCtx;
  
  args_local.size_ = (size_type)args.data_;
  args_local.data_ = (pointer)context;
  bVar1 = FmtHelpers::checkDisplayArgs((ASTContext *)this,&args_local);
  if (bVar1) {
    this_00 = ASTContext::getCompilation((ASTContext *)this);
    evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
         (pointer)evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement;
    evalCtx.flags.m_bits = '\0';
    evalCtx._12_8_ = 0;
    evalCtx._20_8_ = 0;
    evalCtx.queueTarget._4_4_ = 0;
    evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
    evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
    evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
         (pointer)evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
    evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
    evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
    evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>
    .data_ = (pointer)evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                      super_SmallVectorBase<slang::Diagnostic>.firstElement;
    evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>
    .len = 0;
    evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>
    .cap = 2;
    evalCtx.disableRange.startLoc = (SourceLocation)0x0;
    evalCtx.disableRange.endLoc = (SourceLocation)0x0;
    evalCtx.compilation = this_00;
    this_01 = not_null<const_slang::ast::Scope_*>::get((not_null<const_slang::ast::Scope_*> *)this);
    FmtHelpers::formatDisplay_abi_cxx11_
              (&str,(FmtHelpers *)this_01,(Scope *)&evalCtx,(EvalContext *)&args_local,in_R8);
    EvalContext::reportDiags(&evalCtx,(ASTContext *)this);
    __dest = (byte *)0x344831;
    if ((str.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_engaged == true) &&
       (str.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length != 0)) {
      std::__cxx11::string::insert((ulong)&str,(char *)0x0);
      __dest = BumpAllocator::allocate
                         (&this_00->super_BumpAllocator,
                          str.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_string_length,1);
      memcpy(__dest,(void *)str.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
             str.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload._M_value._M_string_length);
    }
    else {
      str.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length = 0;
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&str);
    EvalContext::~EvalContext(&evalCtx);
  }
  else {
    __dest = (byte *)0x344831;
    str.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = 0;
  }
  sVar2._M_str = (char *)__dest;
  sVar2._M_len = str.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_string_length;
  return sVar2;
}

Assistant:

string_view ElabSystemTaskSymbol::createMessage(const ASTContext& context,
                                                span<const Expression* const> args) {
    // Check all arguments.
    if (!FmtHelpers::checkDisplayArgs(context, args))
        return ""sv;

    // Format the message to string.
    auto& comp = context.getCompilation();
    EvalContext evalCtx(comp);
    std::optional<std::string> str = FmtHelpers::formatDisplay(*context.scope, evalCtx, args);
    evalCtx.reportDiags(context);

    if (!str || str->empty())
        return ""sv;

    str->insert(0, ": ");

    // Copy the string into permanent memory.
    auto mem = comp.allocate(str->size(), alignof(char));
    memcpy(mem, str->data(), str->size());

    return string_view(reinterpret_cast<char*>(mem), str->size());
}